

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

string * __thiscall
google::base::CheckOpMessageBuilder::NewString_abi_cxx11_(CheckOpMessageBuilder *this)

{
  string *psVar1;
  CheckOpMessageBuilder *this_local;
  
  std::operator<<((ostream *)this->stream_,")");
  psVar1 = (string *)operator_new(0x20);
  std::__cxx11::ostringstream::str();
  return psVar1;
}

Assistant:

string* CheckOpMessageBuilder::NewString() {
  *stream_ << ")";
  return new string(stream_->str());
}